

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  ImGuiWindow *window_00;
  bool bVar1;
  ImGuiWindow **ppIVar2;
  float fVar3;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 uVar4;
  ImGuiViewportP *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined2 in_stack_ffffffffffffffe4;
  byte in_stack_ffffffffffffffe6;
  byte in_stack_ffffffffffffffe7;
  ImVec2 local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    uVar4 = false;
    if ((GImGui->PlatformIO).Platform_SetImeInputPos != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      fVar3 = (GImGui->PlatformImeLastPos).x;
      in_stack_ffffffffffffffd6 = true;
      if ((fVar3 != 3.4028235e+38) || (uVar4 = in_stack_ffffffffffffffd6, NAN(fVar3))) {
        local_10 = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (ImVec2 *)0x1b3d71);
        fVar3 = ImLengthSqr(&local_10);
        in_stack_ffffffffffffffd6 = 0.0001 < fVar3;
        uVar4 = in_stack_ffffffffffffffd6;
      }
    }
    if ((((bool)uVar4 != false) && (local_8->PlatformImePosViewport != (ImGuiViewportP *)0x0)) &&
       ((local_8->PlatformImePosViewport->PlatformWindowCreated & 1U) != 0)) {
      (*(local_8->PlatformIO).Platform_SetImeInputPos)
                (&local_8->PlatformImePosViewport->super_ImGuiViewport,local_8->PlatformImePos);
      local_8->PlatformImeLastPos = local_8->PlatformImePos;
      local_8->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
    ErrorCheckEndFrame();
    local_8->WithinFrameScopeWithImplicitWindow = false;
    if ((local_8->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((local_8->CurrentWindow->WriteAccessed & 1U) == 0)) {
      local_8->CurrentWindow->Active = false;
    }
    End();
    EndFrameDrawDimmedBackgrounds();
    if (local_8->NavWindowingTarget != (ImGuiWindow *)0x0) {
      NavUpdateWindowingOverlay();
    }
    SetCurrentViewport((ImGuiWindow *)
                       CONCAT17(in_stack_ffffffffffffffe7,
                                CONCAT16(in_stack_ffffffffffffffe6,
                                         CONCAT24(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0))),
                       in_stack_ffffffffffffffd8);
    iVar5 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    if ((local_8->DragDropActive & 1U) != 0) {
      in_stack_ffffffffffffffe7 = (local_8->DragDropPayload).Delivery & 1;
      in_stack_ffffffffffffffd5 = 0;
      if (((local_8->DragDropPayload).DataFrameCount + 1 < local_8->FrameCount) &&
         (in_stack_ffffffffffffffd4 = 1, in_stack_ffffffffffffffd5 = in_stack_ffffffffffffffd4,
         (local_8->DragDropSourceFlags & 0x20U) == 0)) {
        bVar1 = IsMouseDown(local_8->DragDropMouseButton);
        in_stack_ffffffffffffffd4 = bVar1 ^ 0xff;
        in_stack_ffffffffffffffd5 = in_stack_ffffffffffffffd4;
      }
      in_stack_ffffffffffffffe6 = in_stack_ffffffffffffffd5 & 1;
      if (((in_stack_ffffffffffffffe7 & 1) != 0) || (in_stack_ffffffffffffffe6 != 0)) {
        ClearDragDrop();
      }
    }
    if (((local_8->DragDropActive & 1U) != 0) &&
       (local_8->DragDropSourceFrameCount < local_8->FrameCount)) {
      local_8->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      local_8->DragDropWithinSourceOrTarget = false;
    }
    local_8->WithinFrameScope = false;
    local_8->FrameCountEnded = local_8->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    UpdateViewportsEndFrame();
    ImVector<ImGuiWindow_*>::resize
              ((ImVector<ImGuiWindow_*> *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(in_stack_ffffffffffffffd5,
                                                CONCAT14(in_stack_ffffffffffffffd4,
                                                         in_stack_ffffffffffffffd0)))),
               in_stack_ffffffffffffffcc);
    ImVector<ImGuiWindow_*>::reserve
              ((ImVector<ImGuiWindow_*> *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))),
               iVar5);
    for (iVar5 = 0; iVar5 != (local_8->Windows).Size; iVar5 = iVar5 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,iVar5);
      window_00 = *ppIVar2;
      if (((window_00->Active & 1U) == 0) || ((window_00->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer
                  ((ImVector<ImGuiWindow_*> *)
                   CONCAT17(in_stack_ffffffffffffffe7,
                            CONCAT16(in_stack_ffffffffffffffe6,
                                     CONCAT24(in_stack_ffffffffffffffe4,iVar5))),window_00);
      }
    }
    ImVector<ImGuiWindow_*>::swap(&local_8->Windows,&local_8->WindowsSortBuffer);
    (local_8->IO).MetricsActiveWindows = local_8->WindowsActiveCount;
    ((local_8->IO).Fonts)->Locked = false;
    (local_8->IO).MouseWheelH = 0.0;
    (local_8->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(in_stack_ffffffffffffffd5,
                                                CONCAT14(in_stack_ffffffffffffffd4,
                                                         in_stack_ffffffffffffffd0)))),
               in_stack_ffffffffffffffcc);
    memset((local_8->IO).NavInputs,0,0x54);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    ErrorCheckEndFrame();

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}